

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void CheckHash<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>
               (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                e)

{
  bool bVar1;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> expr;
  size_t sVar2;
  char *message;
  ulong uVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  ulong local_20;
  
  uVar3 = (long)*(int *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.
                        impl_ + 0x9e3779b9;
  expr = mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                   (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                                     super_ExprBase.impl_ + 8));
  sVar2 = std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                    (local_30,(Expr)expr.super_ExprBase.impl_);
  local_20 = sVar2 + 0x9e3779b9 + (uVar3 >> 2) + uVar3 * 0x40 ^ uVar3;
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                 ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)&local_38,
                  (Expr)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.
                        impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_30,"hash","ExprHash()(e)",&local_20,(unsigned_long *)&local_40);
  if (local_30[0] == (hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x3d9
               ,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void CheckHash(mp::BasicUnaryExpr<Arg, FIRST, LAST> e) {
  size_t hash = HashCombine<int>(0, e.kind());
  hash = HashCombine<Expr>(hash, e.arg());
  EXPECT_EQ(hash, ExprHash()(e));
}